

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestIterationStart
          (StreamingListener *this,UnitTest *param_1,int iteration)

{
  String local_50;
  string local_40;
  int local_1c;
  UnitTest *pUStack_18;
  int iteration_local;
  UnitTest *param_1_local;
  StreamingListener *this_local;
  
  local_1c = iteration;
  pUStack_18 = param_1;
  param_1_local = (UnitTest *)this;
  String::Format(&local_50,"event=TestIterationStart&iteration=%d\n",(ulong)(uint)iteration);
  String::operator_cast_to_string(&local_40,&local_50);
  Send(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  String::~String(&local_50);
  return;
}

Assistant:

void OnTestIterationStart(const UnitTest& /* unit_test */, int iteration) {
    Send(String::Format("event=TestIterationStart&iteration=%d\n",
                        iteration));
  }